

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O2

string * cmSystemTools::EncodeURL(string *__return_storage_ptr__,string *in,bool escapeSlashes)

{
  byte bVar1;
  pointer pcVar2;
  size_type sVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  undefined7 in_register_00000011;
  size_type sVar7;
  bool bVar8;
  char hexCh [4];
  char local_34;
  
  _hexCh = CONCAT71(in_register_00000011,escapeSlashes) << 0x20;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pcVar2 = (in->_M_dataplus)._M_p;
  sVar3 = in->_M_string_length;
  for (sVar7 = 0; uVar4 = _hexCh, sVar3 != sVar7; sVar7 = sVar7 + 1) {
    bVar1 = pcVar2[sVar7];
    _hexCh = CONCAT71((int7)(_hexCh >> 8),bVar1) & 0xffffffff000000ff;
    uVar5 = _hexCh;
    uVar6 = bVar1 - 0x20;
    _hexCh = uVar5;
    if (uVar6 < 0x3d) {
      if ((0x10000000a0000861U >> ((ulong)uVar6 & 0x3f) & 1) == 0) {
        if (((ulong)uVar6 == 0xf) && (local_34 = SUB81(uVar4,4), bVar8 = local_34 != '\0', bVar8)) {
          _hexCh = CONCAT44(SUB84(uVar4,4),0x463225);
        }
      }
      else {
        snprintf(hexCh,4,"%%%02X");
      }
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmSystemTools::EncodeURL(std::string const& in, bool escapeSlashes)
{
  std::string out;
  for (char c : in) {
    char hexCh[4] = { 0, 0, 0, 0 };
    hexCh[0] = c;
    switch (c) {
      case '+':
      case '?':
      case '\\':
      case '&':
      case ' ':
      case '=':
      case '%':
        snprintf(hexCh, sizeof(hexCh), "%%%02X", static_cast<int>(c));
        break;
      case '/':
        if (escapeSlashes) {
          strcpy(hexCh, "%2F");
        }
        break;
      default:
        break;
    }
    out.append(hexCh);
  }
  return out;
}